

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Generator * kratos::Const::const_gen(void)

{
  bool bVar1;
  element_type *peVar2;
  char local_20 [8];
  shared_ptr<kratos::Generator> local_18;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)const_generator_);
  if (!bVar1) {
    local_20[0] = '\0';
    local_20[1] = '\0';
    local_20[2] = '\0';
    local_20[3] = '\0';
    local_20[4] = '\0';
    local_20[5] = '\0';
    local_20[6] = '\0';
    local_20[7] = '\0';
    std::make_shared<kratos::Generator,decltype(nullptr),char_const(&)[1]>
              ((void **)&local_18,(char (*) [1])local_20);
    std::shared_ptr<kratos::Generator>::operator=
              ((shared_ptr<kratos::Generator> *)const_generator_,&local_18);
    std::shared_ptr<kratos::Generator>::~shared_ptr(&local_18);
  }
  peVar2 = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                      const_generator_);
  return peVar2;
}

Assistant:

Generator *Const::const_gen() {
    if (!const_generator_) const_generator_ = std::make_shared<Generator>(nullptr, "");
    return const_generator_.get();
}